

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O0

matches * atomvec_a(iasctx *ctx,void *v,int spos)

{
  char *__s1;
  char *__s2;
  long lVar1;
  easm_expr *peVar2;
  easm_expr *peVar3;
  int iVar4;
  size_t sVar5;
  easm_expr *peVar6;
  match *pmVar7;
  matches *rres;
  ull num;
  char *end;
  easm_expr *e;
  ull cur;
  ull mask;
  ull cnt;
  ull start;
  easm_expr *tmp;
  int local_100;
  int i;
  int vexprsmax;
  int vexprsnum;
  easm_expr **vexprs;
  easm_expr *expr;
  match res;
  vec *vec;
  int spos_local;
  void *v_local;
  iasctx *ctx_local;
  
  if ((spos == ctx->atomsnum) || (ctx->atoms[spos]->type != LITEM_EXPR)) {
    ctx_local = (iasctx *)0x0;
  }
  else {
    res._176_8_ = v;
    memset(&expr,0,0xb8);
    res.m[1]._0_4_ = spos + 1;
    vexprs = (easm_expr **)ctx->atoms[spos]->expr;
    _vexprsmax = (void *)0x0;
    i = 0;
    local_100 = 0;
    if (((easm_expr *)vexprs)->type != EASM_EXPR_ZVEC) {
      for (; *(int *)vexprs == 0; vexprs = (easm_expr **)vexprs[1]) {
        if (local_100 <= i) {
          if (local_100 == 0) {
            local_100 = 0x10;
          }
          else {
            local_100 = local_100 << 1;
          }
          _vexprsmax = realloc(_vexprsmax,(long)local_100 << 3);
        }
        *(easm_expr **)((long)_vexprsmax + (long)i * 8) = vexprs[2];
        i = i + 1;
      }
      if (local_100 <= i) {
        if (local_100 == 0) {
          local_100 = 0x10;
        }
        else {
          local_100 = local_100 << 1;
        }
        _vexprsmax = realloc(_vexprsmax,(long)local_100 << 3);
      }
      *(easm_expr ***)((long)_vexprsmax + (long)i * 8) = vexprs;
      i = i + 1;
    }
    for (tmp._4_4_ = 0; tmp._4_4_ < i / 2; tmp._4_4_ = tmp._4_4_ + 1) {
      start = *(ull *)((long)_vexprsmax + (long)tmp._4_4_ * 8);
      *(undefined8 *)((long)_vexprsmax + (long)tmp._4_4_ * 8) =
           *(undefined8 *)((long)_vexprsmax + (long)((i + -1) - tmp._4_4_) * 8);
      *(ull *)((long)_vexprsmax + (long)((i + -1) - tmp._4_4_) * 8) = start;
    }
    cnt = 0;
    mask = (ull)i;
    cur = 0;
    e = (easm_expr *)0x0;
    for (tmp._4_4_ = 0; (ulong)(long)tmp._4_4_ < mask; tmp._4_4_ = tmp._4_4_ + 1) {
      end = *(char **)((long)_vexprsmax + (long)tmp._4_4_ * 8);
      if (*(int *)end != 0x14) {
        if (*(int *)end != 0x11) {
          return (matches *)0x0;
        }
        __s1 = *(char **)((long)end + 0x40);
        __s2 = *(char **)res._176_8_;
        sVar5 = strlen(*(char **)res._176_8_);
        iVar4 = strncmp(__s1,__s2,sVar5);
        if (iVar4 != 0) {
          return (matches *)0x0;
        }
        lVar1 = *(long *)(end + 0x40);
        sVar5 = strlen(*(char **)res._176_8_);
        peVar6 = (easm_expr *)strtoull((char *)(lVar1 + sVar5),(char **)&num,10);
        if (*(char *)num != '\0') {
          return (matches *)0x0;
        }
        peVar3 = peVar6;
        peVar2 = peVar6;
        if ((cur != 0) && (peVar3 = (easm_expr *)cnt, peVar2 = e, peVar6 != e)) {
          return (matches *)0x0;
        }
        cnt = (ull)peVar3;
        e = (easm_expr *)((long)&peVar2->type + 1);
        cur = 1L << ((byte)tmp._4_4_ & 0x3f) | cur;
      }
    }
    iVar4 = setbf((match *)&expr,*(bitfield **)(res._176_8_ + 8),cnt);
    if (iVar4 == 0) {
      ctx_local = (iasctx *)0x0;
    }
    else {
      iVar4 = setbf((match *)&expr,*(bitfield **)(res._176_8_ + 0x10),mask);
      if (iVar4 == 0) {
        ctx_local = (iasctx *)0x0;
      }
      else {
        if (*(long *)(res._176_8_ + 0x18) == 0) {
          if (cur != (1L << ((byte)mask & 0x3f)) - 1U) {
            return (matches *)0x0;
          }
        }
        else {
          iVar4 = setbf((match *)&expr,*(bitfield **)(res._176_8_ + 0x18),cur);
          if (iVar4 == 0) {
            return (matches *)0x0;
          }
        }
        ctx_local = (iasctx *)emptymatches();
        if (*(int *)((long)&ctx_local->varinfo + 4) <= *(int *)&ctx_local->varinfo) {
          if (*(int *)((long)&ctx_local->varinfo + 4) == 0) {
            *(int *)((long)&ctx_local->varinfo + 4) = 0x10;
          }
          else {
            *(int *)((long)&ctx_local->varinfo + 4) = *(int *)((long)&ctx_local->varinfo + 4) << 1;
          }
          pmVar7 = (match *)realloc((match *)ctx_local->isa,
                                    (long)*(int *)((long)&ctx_local->varinfo + 4) * 0xb8);
          ctx_local->isa = (disisa *)pmVar7;
        }
        iVar4 = *(int *)&ctx_local->varinfo;
        *(int *)&ctx_local->varinfo = iVar4 + 1;
        memcpy((match *)ctx_local->isa + iVar4,&expr,0xb8);
      }
    }
  }
  return (matches *)ctx_local;
}

Assistant:

struct matches *atomvec_a APROTO {
	const struct vec *vec = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct match res = { 0, .lpos = spos+1 };
	const struct easm_expr *expr = ctx->atoms[spos]->expr;
	const struct easm_expr **vexprs = 0;
	int vexprsnum = 0;
	int vexprsmax = 0;
	if (expr->type != EASM_EXPR_ZVEC) {
		while (expr->type == EASM_EXPR_VEC) {
			ADDARRAY(vexprs, expr->e2);
			expr = expr->e1;
		}
		ADDARRAY(vexprs, expr);
	}
	int i;
	for (i = 0; i < vexprsnum/2; i++) {
		const struct easm_expr *tmp = vexprs[i];
		vexprs[i] = vexprs[vexprsnum-1-i];
		vexprs[vexprsnum-1-i] = tmp;
	}
	ull start = 0, cnt = vexprsnum, mask = 0, cur = 0;
	for (i = 0; i < cnt; i++) {
		const struct easm_expr *e = vexprs[i];
		if (e->type == EASM_EXPR_DISCARD) {
		} else if (e->type == EASM_EXPR_REG) {
			if (strncmp(e->str, vec->name, strlen(vec->name)))
				return 0;
			char *end;
			ull num = strtoull(e->str + strlen(vec->name), &end, 10);
			if (*end)
				return 0;
			if (mask) {
				if (num != cur)
					return 0;
				cur++;
			} else {
				start = num;
				cur = num + 1;
			}
			mask |= 1ull << i;
		} else {
			return 0;
		}
	}
	if (!setbf(&res, vec->bf, start))
		return 0;
	if (!setbf(&res, vec->cnt, cnt))
		return 0;
	if (vec->mask) {
		if (!setbf(&res, vec->mask, mask))
			return 0;
	} else {
		if (mask != (1ull << cnt) - 1)
		       return 0;	
	}
	struct matches *rres = emptymatches();
	ADDARRAY(rres->m, res);
	return rres;
}